

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterFactory.cpp
# Opt level: O0

string * ApprovalTests::getOsPrefix_abi_cxx11_(void)

{
  bool bVar1;
  string *in_RDI;
  allocator local_1e;
  allocator local_1d [20];
  allocator local_9 [9];
  
  bVar1 = SystemUtils::isMacOs();
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Mac::",local_9);
    ::std::allocator<char>::~allocator((allocator<char> *)local_9);
  }
  else {
    bVar1 = SystemUtils::isWindowsOs();
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)in_RDI,"Windows::",local_1d);
      ::std::allocator<char>::~allocator((allocator<char> *)local_1d);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)in_RDI,"Linux::",&local_1e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    }
  }
  return in_RDI;
}

Assistant:

std::string getOsPrefix()
    {
        if (SystemUtils::isMacOs())
        {
            return "Mac::";
        }

        if (SystemUtils::isWindowsOs())
        {
            return "Windows::";
        }

        return "Linux::";
    }